

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkReverseTopoOrderTest(Abc_Ntk_t *p)

{
  abctime aVar1;
  abctime aVar2;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pObj;
  abctime time;
  abctime time_00;
  uint i;
  Vec_Int_t *in_RSI;
  
  aVar1 = Abc_Clock();
  Abc_NtkReverseTopoOrder(p);
  pVVar3 = p->vTopo;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vTopo->pArray = (int *)0x0;
      pVVar3 = p->vTopo;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_001ec2f4;
    }
    free(pVVar3);
    p->vTopo = (Vec_Int_t *)0x0;
  }
LAB_001ec2f4:
  aVar2 = Abc_Clock();
  Abc_PrintTime((int)aVar2 - (int)aVar1,(char *)in_RSI,time);
  aVar1 = Abc_Clock();
  pVVar3 = Vec_IntAlloc(1000);
  for (i = 0; (int)i < p->vObjs->nSize; i = i + 1) {
    in_RSI = (Vec_Int_t *)(ulong)i;
    pObj = Abc_NtkObj(p,i);
    if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
      pVVar3->nSize = 0;
      Abc_NtkIncrementTravId(p);
      in_RSI = pVVar3;
      Abc_NtkReverse_rec(pObj,pVVar3);
    }
  }
  free(pVVar3->pArray);
  free(pVVar3);
  aVar2 = Abc_Clock();
  Abc_PrintTime((int)aVar2 - (int)aVar1,(char *)in_RSI,time_00);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrderTest( Abc_Ntk_t * p )
{
    Vec_Int_t * vVisited;
    Abc_Obj_t * pObj;
    int i;//, k, iBeg, iEnd;
    abctime clk = Abc_Clock();
    Abc_NtkReverseTopoOrder( p );
/*
    printf( "Reverse topological order for nodes:\n" );
    Abc_NtkForEachNode( p, pObj, i )
    {
        iBeg = Abc_NtkTopoHasBeg( pObj );
        iEnd = Abc_NtkTopoHasEnd( pObj );
        printf( "Node %4d : ", Abc_ObjId(pObj) );
        for ( k = iEnd - 1; k >= iBeg; k-- )
            printf( "%d ", Vec_IntEntry(p->vTopo, k) );
        printf( "\n" );
    }
*/
    Vec_IntFreeP( &p->vTopo );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // compute regular fanout orders
    clk = Abc_Clock();
    vVisited = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Vec_IntClear( vVisited );
        Abc_NtkIncrementTravId( p ); 
        Abc_NtkReverse_rec( pObj, vVisited );
    }
    Vec_IntFree( vVisited );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}